

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int c;
  bool bVar1;
  TextureChannelClass TVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int y1;
  int iVar7;
  int c_00;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float local_1c8;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec2 local_f8;
  Vec2 local_f0;
  Vec2 local_e8;
  Vec2 local_e0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  ColorQuad quad0;
  ColorQuad quad1;
  
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar8 = floorf(uBounds0.m_data[0] + -0.5);
  fVar9 = floorf(uBounds0.m_data[1] + -0.5);
  fVar10 = floorf(uBounds1.m_data[0] + -0.5);
  fVar11 = floorf(uBounds1.m_data[1] + -0.5);
  fVar12 = floorf(vBounds0.m_data[0] + -0.5);
  fVar13 = floorf(vBounds0.m_data[1] + -0.5);
  fVar14 = floorf(vBounds1.m_data[0] + -0.5);
  fVar15 = floorf(vBounds1.m_data[1] + -0.5);
  TVar2 = getTextureChannelClass((level0->m_format).type);
  if (TVar2 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    local_1c8 = computeBilinearSearchStepForSnorm(prec);
  }
  else {
    local_1c8 = 0.0;
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_1c8 = computeBilinearSearchStepForUnorm(prec);
    }
  }
  iVar3 = (int)fVar12;
  while (c = iVar3, c <= (int)fVar13) {
    fVar12 = (float)c;
    iVar7 = (int)fVar8;
    while (iVar3 = c + 1, iVar7 <= (int)fVar9) {
      ColorQuad::ColorQuad(&quad0);
      iVar3 = TexVerifierUtil::wrap(sampler->wrapS,iVar7,dim);
      c_00 = iVar7 + 1;
      iVar4 = TexVerifierUtil::wrap(sampler->wrapS,c_00,dim);
      iVar5 = TexVerifierUtil::wrap(sampler->wrapT,c,dim_00);
      iVar6 = TexVerifierUtil::wrap(sampler->wrapT,c + 1,dim_00);
      lookupQuad(&quad0,level0,sampler,iVar3,iVar4,iVar5,iVar6,coordZ);
      fVar16 = local_1c8;
      if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        fVar16 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
      }
      fVar17 = (float)iVar7;
      fVar25 = (uBounds0.m_data[0] + -0.5) - fVar17;
      fVar26 = (uBounds0.m_data[1] + -0.5) - fVar17;
      auVar20._4_4_ = fVar26;
      auVar20._0_4_ = fVar25;
      auVar20._8_4_ = 0.0 - fVar17;
      auVar20._12_4_ = 0.0 - fVar17;
      auVar20 = minps(_DAT_007f0910,auVar20);
      fVar17 = (vBounds0.m_data[0] + -0.5) - fVar12;
      fVar27 = (vBounds0.m_data[1] + -0.5) - fVar12;
      auVar21._4_4_ = fVar27;
      auVar21._0_4_ = fVar17;
      auVar21._8_4_ = 0.0 - fVar12;
      auVar21._12_4_ = 0.0 - fVar12;
      auVar21 = minps(_DAT_007f0910,auVar21);
      iVar3 = (int)fVar14;
      while (iVar4 = iVar3, iVar7 = c_00, iVar4 <= (int)fVar15) {
        fVar18 = (float)iVar4;
        iVar7 = (int)fVar10;
        while (iVar3 = iVar4 + 1, iVar7 <= (int)fVar11) {
          ColorQuad::ColorQuad(&quad1);
          iVar3 = TexVerifierUtil::wrap(sampler->wrapS,iVar7,dim_01);
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar7 + 1,dim_01);
          iVar6 = TexVerifierUtil::wrap(sampler->wrapT,iVar4,dim_02);
          y1 = TexVerifierUtil::wrap(sampler->wrapT,iVar4 + 1,dim_02);
          lookupQuad(&quad1,level1,sampler,iVar3,iVar5,iVar6,y1,coordZ);
          fVar19 = local_1c8;
          if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            fVar19 = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
          }
          fVar22 = (float)iVar7;
          local_e0.m_data[1] = (float)(-(uint)(0.0 <= fVar26) & auVar20._4_4_);
          local_e0.m_data[0] = (float)(-(uint)(0.0 <= fVar25) & auVar20._0_4_);
          local_e8.m_data[1] = (float)(-(uint)(0.0 <= fVar27) & auVar21._4_4_);
          local_e8.m_data[0] = (float)(-(uint)(0.0 <= fVar17) & auVar21._0_4_);
          auVar24._0_4_ = (uBounds1.m_data[0] + -0.5) - fVar22;
          auVar24._4_4_ = (uBounds1.m_data[1] + -0.5) - fVar22;
          auVar24._8_4_ = 0.0 - fVar22;
          auVar24._12_4_ = 0.0 - fVar22;
          auVar23 = minps(_DAT_007f0910,auVar24);
          local_f0.m_data[0] = (float)(-(uint)(0.0 <= auVar24._0_4_) & auVar23._0_4_);
          local_f0.m_data[1] = (float)(-(uint)(0.0 <= auVar24._4_4_) & auVar23._4_4_);
          auVar23._0_4_ = (vBounds1.m_data[0] + -0.5) - fVar18;
          auVar23._4_4_ = (vBounds1.m_data[1] + -0.5) - fVar18;
          auVar23._8_4_ = 0.0 - fVar18;
          auVar23._12_4_ = 0.0 - fVar18;
          auVar24 = minps(_DAT_007f0910,auVar23);
          local_f8.m_data[0] = (float)(-(uint)(0.0 <= auVar23._0_4_) & auVar24._0_4_);
          local_f8.m_data[1] = (float)(-(uint)(0.0 <= auVar23._4_4_) & auVar24._4_4_);
          bVar1 = is2DTrilinearFilterResultValid
                            (prec,&quad0,&quad1,&local_e0,&local_e8,&local_f0,&local_f8,fBounds,
                             (float)(~-(uint)(fVar16 <= fVar19) & (uint)fVar19 |
                                    -(uint)(fVar16 <= fVar19) & (uint)fVar16),result);
          iVar7 = iVar7 + 1;
          if (bVar1) goto LAB_007c3966;
        }
      }
    }
  }
LAB_007c3966:
  return c <= (int)fVar13;
}

Assistant:

static bool isLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
												   const ConstPixelBufferAccess&	level1,
												   const Sampler&					sampler,
												   const LookupPrecision&			prec,
												   const Vec2&						coord,
												   const int						coordZ,
												   const Vec2&						fBounds,
												   const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					w0				= level0.getWidth();
	const int					w1				= level1.getWidth();
	const int					h0				= level0.getHeight();
	const int					h1				= level1.getHeight();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int					minJ0			= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int					maxJ0			= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int					minJ1			= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int					maxJ1			= deFloorFloatToInt32(vBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(level0.getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			ColorQuad	quad0;
			float		searchStep0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);
				lookupQuad(quad0, level0, sampler, x0, x1, y0, y1, coordZ);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep0 = computeBilinearSearchStepFromFloatQuad(prec, quad0);
				else
					searchStep0 = cSearchStep;
			}

			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					ColorQuad	quad1;
					float		searchStep1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);
						lookupQuad(quad1, level1, sampler, x0, x1, y0, y1, coordZ);

						if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
							searchStep1 = computeBilinearSearchStepFromFloatQuad(prec, quad1);
						else
							searchStep1 = cSearchStep;
					}

					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);

					if (is2DTrilinearFilterResultValid(prec, quad0, quad1, Vec2(minA0, maxA0), Vec2(minB0, maxB0), Vec2(minA1, maxA1), Vec2(minB1, maxB1),
													   fBounds, de::min(searchStep0, searchStep1), result))
						return true;
				}
			}
		}
	}

	return false;
}